

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

void __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::setupTest(ShaderStorageBufferLayoutBindingCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float f [2];
  undefined8 local_18;
  
  local_18 = 0x3f4000003e800000;
  iVar1 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6c8))
            (1,&(this->super_LayoutBindingBaseCase).field_0x224);
  iVar1 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x40))
            (0x90d2,*(undefined4 *)&(this->super_LayoutBindingBaseCase).field_0x224);
  iVar1 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x150))(0x90d2,8,&local_18,0x88e4);
  return;
}

Assistant:

void setupTest(void)
	{
		const float f[2] = { 0.25f, 0.75f };
		gl().genBuffers(1, &m_buffername);
		gl().bindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffername);
		gl().bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(f), f, GL_STATIC_DRAW);
	}